

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O0

int Dar_BalanceFindLeft(Vec_Ptr_t *vSuper)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int local_2c;
  int Current;
  Aig_Obj_t *pObjLeft;
  Aig_Obj_t *pObjRight;
  Vec_Ptr_t *vSuper_local;
  
  iVar1 = Vec_PtrSize(vSuper);
  if (iVar1 < 3) {
    vSuper_local._4_4_ = 0;
  }
  else {
    local_2c = Vec_PtrSize(vSuper);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,local_2c + -2);
    for (local_2c = local_2c + -3; -1 < local_2c; local_2c = local_2c + -1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,local_2c);
      pAVar4 = Aig_Regular(pAVar4);
      iVar1 = Aig_ObjLevel(pAVar4);
      pAVar4 = Aig_Regular(pAVar3);
      iVar2 = Aig_ObjLevel(pAVar4);
      if (iVar1 != iVar2) break;
    }
    vSuper_local._4_4_ = local_2c + 1;
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,vSuper_local._4_4_);
    pAVar4 = Aig_Regular(pAVar4);
    iVar1 = Aig_ObjLevel(pAVar4);
    pAVar3 = Aig_Regular(pAVar3);
    iVar2 = Aig_ObjLevel(pAVar3);
    if (iVar1 != iVar2) {
      __assert_fail("Aig_ObjLevel(Aig_Regular(pObjLeft)) == Aig_ObjLevel(Aig_Regular(pObjRight))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                    ,0x102,"int Dar_BalanceFindLeft(Vec_Ptr_t *)");
    }
  }
  return vSuper_local._4_4_;
}

Assistant:

int Dar_BalanceFindLeft( Vec_Ptr_t * vSuper )
{
    Aig_Obj_t * pObjRight, * pObjLeft;
    int Current;
    // if two or less nodes, pair with the first
    if ( Vec_PtrSize(vSuper) < 3 )
        return 0;
    // set the pointer to the one before the last
    Current = Vec_PtrSize(vSuper) - 2;
    pObjRight = (Aig_Obj_t *)Vec_PtrEntry( vSuper, Current );
    // go through the nodes to the left of this one
    for ( Current--; Current >= 0; Current-- )
    {
        // get the next node on the left
        pObjLeft = (Aig_Obj_t *)Vec_PtrEntry( vSuper, Current );
        // if the level of this node is different, quit the loop
        if ( Aig_ObjLevel(Aig_Regular(pObjLeft)) != Aig_ObjLevel(Aig_Regular(pObjRight)) )
            break;
    }
    Current++;    
    // get the node, for which the equality holds
    pObjLeft = (Aig_Obj_t *)Vec_PtrEntry( vSuper, Current );
    assert( Aig_ObjLevel(Aig_Regular(pObjLeft)) == Aig_ObjLevel(Aig_Regular(pObjRight)) );
    return Current;
}